

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O1

int Map_CutMergeTwo(Map_Cut_t *pCut1,Map_Cut_t *pCut2,Map_Node_t **ppNodes,int nNodesMax)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  Map_Node_t *pMVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  uVar10 = (ulong)(uint)nNodesMax;
  cVar3 = pCut1->nLeaves;
  uVar8 = (uint)cVar3;
  if (uVar8 == nNodesMax) {
    if (pCut2->nLeaves == nNodesMax) {
      if (0 < nNodesMax) {
        uVar11 = 0;
        do {
          if (pCut1->ppLeaves[uVar11] != pCut2->ppLeaves[uVar11]) {
            return 0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (0 < nNodesMax) {
        uVar11 = 0;
        do {
          ppNodes[uVar11] = pCut1->ppLeaves[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
        return nNodesMax;
      }
      return nNodesMax;
    }
    if (nNodesMax + -1 == (int)pCut2->nLeaves) {
      if (0 < nNodesMax) {
        uVar11 = 0;
        iVar12 = 0;
        do {
          if ((pCut1->ppLeaves[uVar11] !=
               *(Map_Node_t **)((long)pCut2 + uVar11 * 8 + (long)iVar12 * -8 + 0x18)) &&
             (bVar17 = iVar12 == 1, iVar12 = 1, bVar17)) {
            return 0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (0 < nNodesMax) {
        uVar11 = 0;
        do {
          ppNodes[uVar11] = pCut1->ppLeaves[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
        return nNodesMax;
      }
      return nNodesMax;
    }
  }
  else if ((nNodesMax - 1U == uVar8) && (pCut2->nLeaves == nNodesMax)) {
    if (0 < nNodesMax) {
      uVar11 = 0;
      iVar12 = 0;
      do {
        if ((*(Map_Node_t **)((long)pCut1 + uVar11 * 8 + (long)iVar12 * -8 + 0x18) !=
             pCut2->ppLeaves[uVar11]) && (bVar17 = iVar12 == 1, iVar12 = 1, bVar17)) {
          return 0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (0 < nNodesMax) {
      uVar11 = 0;
      do {
        ppNodes[uVar11] = pCut2->ppLeaves[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
      return nNodesMax;
    }
    return nNodesMax;
  }
  cVar4 = pCut2->nLeaves;
  uVar10 = (ulong)uVar8;
  if (0 < (long)cVar4) {
    lVar9 = (long)(int)uVar8;
    lVar16 = 0;
    do {
      if (cVar3 < '\x01') {
LAB_003d4411:
        if (uVar8 == nNodesMax) {
          return 0;
        }
        lVar15 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        ppNodes[lVar15] = pCut2->ppLeaves[lVar16];
      }
      else {
        bVar17 = '\0' < cVar3;
        if (pCut2->ppLeaves[lVar16] != pCut1->ppLeaves[0]) {
          lVar15 = 0;
          do {
            if (uVar10 - 1 == lVar15) goto LAB_003d4411;
            lVar1 = lVar15 + 1;
            lVar6 = lVar15 + 1;
            lVar15 = lVar1;
          } while (pCut2->ppLeaves[lVar16] != pCut1->ppLeaves[lVar6]);
          bVar17 = lVar1 < lVar9;
        }
        if (!bVar17) goto LAB_003d4411;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != cVar4);
  }
  if ('\0' < cVar3) {
    uVar11 = 0;
    do {
      ppNodes[uVar11] = pCut1->ppLeaves[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (1 < (int)uVar8) {
    uVar11 = 1;
    uVar10 = 0;
    do {
      uVar2 = uVar10 + 1;
      uVar14 = uVar10 & 0xffffffff;
      uVar13 = uVar11;
      do {
        uVar7 = uVar13 & 0xffffffff;
        if (ppNodes[(int)uVar14]->Num <= ppNodes[uVar13]->Num) {
          uVar7 = uVar14;
        }
        uVar14 = uVar7;
        uVar13 = uVar13 + 1;
      } while (uVar8 != uVar13);
      pMVar5 = ppNodes[uVar10];
      ppNodes[uVar10] = ppNodes[(int)uVar14];
      ppNodes[(int)uVar14] = pMVar5;
      uVar11 = uVar11 + 1;
      uVar10 = uVar2;
    } while (uVar2 != uVar8 - 1);
  }
  return uVar8;
}

Assistant:

int Map_CutMergeTwo( Map_Cut_t * pCut1, Map_Cut_t * pCut2, Map_Node_t * ppNodes[], int nNodesMax )
{
    Map_Node_t * pNodeTemp;
    int nTotal, i, k, min, fMismatch;

    // check the special case when at least of the cuts is the largest
    if ( pCut1->nLeaves == nNodesMax )
    {
        if ( pCut2->nLeaves == nNodesMax )
        {
            // return 0 if the cuts are different
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i] )
                    return 0;
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
        else if ( pCut2->nLeaves == nNodesMax - 1 ) 
        {
            // return 0 if the cuts are different
            fMismatch = 0;
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i - fMismatch] )
                {
                    if ( fMismatch == 1 )
                        return 0;
                    fMismatch = 1;
                }
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
    }
    else if ( pCut1->nLeaves == nNodesMax - 1 && pCut2->nLeaves == nNodesMax )
    {
        // return 0 if the cuts are different
        fMismatch = 0;
        for ( i = 0; i < nNodesMax; i++ )
            if ( pCut1->ppLeaves[i - fMismatch] != pCut2->ppLeaves[i] )
            {
                if ( fMismatch == 1 )
                    return 0;
                fMismatch = 1;
            }
        // return nNodesMax if they are the same
        for ( i = 0; i < nNodesMax; i++ )
            ppNodes[i] = pCut2->ppLeaves[i];
        return nNodesMax;
    }

    // count the number of unique entries in pCut2
    nTotal = pCut1->nLeaves;
    for ( i = 0; i < pCut2->nLeaves; i++ )
    {
        // try to find this entry among the leaves of pCut1
        for ( k = 0; k < pCut1->nLeaves; k++ )
            if ( pCut2->ppLeaves[i] == pCut1->ppLeaves[k] )
                break;
        if ( k < pCut1->nLeaves ) // found
            continue;
        // we found a new entry to add
        if ( nTotal == nNodesMax )
            return 0;
        ppNodes[nTotal++] = pCut2->ppLeaves[i];
    }
    // we know that the feasible cut exists

    // add the starting entries
    for ( k = 0; k < pCut1->nLeaves; k++ )
        ppNodes[k] = pCut1->ppLeaves[k];

    // selection-sort the entries
    for ( i = 0; i < nTotal - 1; i++ )
    {
        min = i;
        for ( k = i+1; k < nTotal; k++ )
//            if ( ppNodes[k] < ppNodes[min] ) // reported bug fix (non-determinism!)
            if ( ppNodes[k]->Num < ppNodes[min]->Num )
                min = k;
        pNodeTemp    = ppNodes[i];
        ppNodes[i]   = ppNodes[min];
        ppNodes[min] = pNodeTemp;
    }

    return nTotal;
}